

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O2

string * __thiscall
cfd::api::HDWalletApi::CreateExtPubkey
          (string *__return_storage_ptr__,HDWalletApi *this,string *extkey,NetType net_type)

{
  uint32_t uVar1;
  CfdException *this_00;
  uint32_t uVar2;
  uint32_t local_104;
  undefined1 local_100 [112];
  ExtPrivkey privkey;
  
  core::ExtPrivkey::ExtPrivkey(&privkey,extkey);
  uVar1 = core::ExtPrivkey::GetVersion(&privkey);
  uVar2 = 0x4358394;
  if (net_type == kLiquidV1) {
    uVar2 = 0x488ade4;
  }
  if (net_type == kMainnet) {
    uVar2 = 0x488ade4;
  }
  if (uVar1 == uVar2) {
    core::ExtPrivkey::GetExtPubkey((ExtPubkey *)local_100,&privkey);
    core::ExtPubkey::ToString_abi_cxx11_(__return_storage_ptr__,(ExtPubkey *)local_100);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)local_100);
    core::ExtPrivkey::~ExtPrivkey(&privkey);
    return __return_storage_ptr__;
  }
  local_100._0_8_ = "cfdapi_hdwallet.cpp";
  local_100._8_4_ = 0x125;
  local_100._16_8_ = (long)"CfdCreateExtPubkey" + 3;
  local_104 = core::ExtPrivkey::GetVersion(&privkey);
  core::logger::warn<unsigned_int>
            ((CfdSourceLocation *)local_100,"Version unmatch. key version: {}",&local_104);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_100,"extkey networkType unmatch.",(allocator *)&local_104);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_100);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string HDWalletApi::CreateExtPubkey(
    const std::string& extkey, NetType net_type) const {
  ExtPrivkey privkey(extkey);
  uint32_t check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);
  if (privkey.GetVersion() != check_version) {
    warn(
        CFD_LOG_SOURCE, "Version unmatch. key version: {}",
        privkey.GetVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return privkey.GetExtPubkey().ToString();
}